

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_remove(Context *context,IntrinsicResult partialResult)

{
  int iVar1;
  char *__filename;
  Value VStack_58;
  undefined1 local_48 [16];
  String path;
  String local_28;
  
  MiniScript::String::String(&local_28,"path");
  MiniScript::Context::GetVar
            ((Context *)local_48,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  MiniScript::Value::ToString((Value *)&path,(Machine *)local_48);
  MiniScript::Value::~Value((Value *)local_48);
  MiniScript::String::release(&local_28);
  if (path.ss == (StringStorage *)0x0) {
    __filename = "";
  }
  else {
    __filename = (path.ss)->data;
  }
  iVar1 = remove(__filename);
  MiniScript::Value::Truth(&VStack_58,iVar1 == 0);
  MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&VStack_58,true);
  MiniScript::Value::~Value(&VStack_58);
  MiniScript::String::release(&path);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_remove(Context *context, IntrinsicResult partialResult) {
	String path = context->GetVar("path").ToString();
	#if _WIN32 || _WIN64
		bool isDir = false;
		struct _stati64 stats;
		if (_stati64(path.c_str(), &stats) == 0) {
			isDir = ((stats.st_mode & _S_IFDIR) != 0);
		}
		bool ok;
		if (isDir) ok = RemoveDirectory(path.c_str());
		else ok = DeleteFile(path.c_str());
		int err = ok ? 0 : 1;
	#else
		int err = remove(path.c_str());
	#endif
	return IntrinsicResult(Value::Truth(err == 0));
}